

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O2

Ptr __thiscall hwnet::TCPSocket::Start(TCPSocket *this)

{
  Poller *this_00;
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Ptr PVar2;
  Ptr local_58;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  bool local_31 [8];
  bool expected;
  
  local_31[0] = false;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    ((atomic<bool> *)(in_RSI + 0xa78),local_31,true,memory_order_seq_cst);
  if (bVar1) {
    this_00 = *(Poller **)(in_RSI + 0x930);
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x18));
    local_58.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
    if (local_48 != (element_type *)0x0) {
      local_58.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_48->events;
    }
    local_58.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_40._M_pi;
    local_48 = (element_type *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Poller::Add(this_00,&local_58,0xe);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  }
  std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::TCPSocket,void>
            ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)this,
             (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x18));
  PVar2.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar2.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSocket::Ptr Start() {
		bool expected = false;
		if(this->started.compare_exchange_strong(expected,true)) {
			this->poller_->Add(shared_from_this(),Poller::Read | Poller::Write | Poller::ET);
			//this->poller_->Add(shared_from_this(),Poller::Read | Poller::ET);
		}
		return shared_from_this();
	}